

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

int __thiscall
CTextRender::CharToGlyph(CTextRender *this,CTextCursor *pCursor,int NumChars,float *pLineWidth)

{
  int iVar1;
  int iVar2;
  CScaledGlyph *pCVar3;
  float *in_RCX;
  int in_EDX;
  long in_RSI;
  CScaledGlyph *rScaled;
  int Line;
  int LastGlyphIndex;
  int i;
  int GlyphIndex;
  int NumGlyphs;
  int CursorChars;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int local_4;
  
  local_2c = 0;
  iVar2 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                    ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30));
  if ((iVar2 == 0) || (in_EDX == 0)) {
    if (in_RCX != (float *)0x0) {
      *in_RCX = 0.0;
    }
    local_4 = 0;
  }
  else {
    local_34 = -1;
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      pCVar3 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                         ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30),
                          local_38);
      local_2c = pCVar3->m_NumChars + local_2c;
      if (in_EDX < local_2c) {
        local_34 = local_38;
        break;
      }
    }
    local_3c = local_34;
    if (local_34 < 0) {
      local_3c = iVar2 + -1;
      local_34 = iVar2;
    }
    if (in_RCX != (float *)0x0) {
      pCVar3 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                         ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30),
                          local_3c);
      iVar1 = pCVar3->m_Line;
      while( true ) {
        if ((iVar2 <= local_3c) || (iVar2 <= local_3c + 1)) goto LAB_00144495;
        pCVar3 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                           ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30)
                            ,local_3c);
        if (iVar1 < pCVar3->m_Line) break;
        local_3c = local_3c + 1;
      }
      local_3c = local_3c + -1;
LAB_00144495:
      pCVar3 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                         ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30),
                          local_3c);
      *in_RCX = pCVar3->m_pGlyph->m_AdvanceX * pCVar3->m_Size + (pCVar3->m_Advance).field_0.x;
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

int CTextRender::CharToGlyph(CTextCursor *pCursor, int NumChars, float *pLineWidth)
{
	int CursorChars = 0;
	int NumGlyphs = pCursor->m_Glyphs.size();
	if(NumGlyphs == 0 || NumChars == 0)
	{
		if (pLineWidth)
			*pLineWidth = 0.0f;
		return 0;
	}

	int GlyphIndex = -1;
	for(int i = 0; i < NumGlyphs; ++i)
	{
		CursorChars += pCursor->m_Glyphs[i].m_NumChars;
		if(CursorChars > NumChars)
		{
			GlyphIndex = i;
			break;
		}
	}

	int LastGlyphIndex = GlyphIndex;

	if(GlyphIndex < 0)
	{
		GlyphIndex = NumGlyphs;
		LastGlyphIndex = GlyphIndex - 1;
	}

	if(pLineWidth)
	{
		const int Line = pCursor->m_Glyphs[LastGlyphIndex].m_Line;

		for(; LastGlyphIndex < NumGlyphs; ++LastGlyphIndex)
		{
			if(LastGlyphIndex + 1 >= NumGlyphs)
				break;

			if(pCursor->m_Glyphs[LastGlyphIndex].m_Line > Line)
			{
				LastGlyphIndex -= 1;
				break;
			}
		}

		const CScaledGlyph& rScaled = pCursor->m_Glyphs[LastGlyphIndex];
		*pLineWidth = rScaled.m_Advance.x + rScaled.m_pGlyph->m_AdvanceX * rScaled.m_Size;
	}

	return GlyphIndex;
}